

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O0

bool __thiscall jbcoin::STPathSet::assembleAdd(STPathSet *this,STPath *base,STPathElement *tail)

{
  bool bVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
  *__x;
  reference this_00;
  undefined1 local_40 [16];
  STPath *newPath;
  reverse_iterator it;
  STPathElement *tail_local;
  STPath *base_local;
  STPathSet *this_local;
  
  it.current._M_current =
       (__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
        )(__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>
          )tail;
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back(&this->value,base);
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::rbegin
            ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&newPath);
  local_40._8_8_ =
       std::
       reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
       ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
                    *)&newPath);
  STPath::push_back((STPath *)local_40._8_8_,(STPathElement *)it.current._M_current);
  do {
    __x = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
                        *)&newPath);
    std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::rend
              ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)local_40);
    bVar1 = std::operator!=(__x,(reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
                                 *)local_40);
    if (!bVar1) {
      return true;
    }
    this_00 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<jbcoin::STPath_*,_std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>_>_>
                           *)&newPath);
    bVar1 = STPath::operator==(this_00,(STPath *)local_40._8_8_);
  } while (!bVar1);
  std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::pop_back(&this->value);
  return false;
}

Assistant:

bool
STPathSet::assembleAdd(STPath const& base, STPathElement const& tail)
{ // assemble base+tail and add it to the set if it's not a duplicate
    value.push_back (base);

    std::vector<STPath>::reverse_iterator it = value.rbegin ();

    STPath& newPath = *it;
    newPath.push_back (tail);

    while (++it != value.rend ())
    {
        if (*it == newPath)
        {
            value.pop_back ();
            return false;
        }
    }
    return true;
}